

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::fileFixify
          (QString *__return_storage_ptr__,MakefileGenerator *this,QString *file,FileFixifyTypes fix
          ,bool canon)

{
  long lVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  SourceFiles *pSVar6;
  QString file_00;
  QString file_01;
  QString string;
  QString file_02;
  QString string_00;
  QString string_01;
  QString string_02;
  QString file_03;
  QString string_03;
  Data *pDVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Data *pDVar14;
  ulong n;
  longlong __tmp;
  Data *pDVar15;
  longlong lVar16;
  QStringBuilder<QString,_QString> *pQVar17;
  QMakeProject *pQVar18;
  int iVar19;
  char16_t *tmp;
  Data *pDVar20;
  QMakeProject *pQVar21;
  QStringBuilder<QString,_QString> *unaff_R14;
  long in_FS_OFFSET;
  QLatin1String QVar22;
  QByteArrayView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QStringView config;
  QStringView QVar28;
  QStringView QVar29;
  undefined1 in_stack_fffffffffffffe18 [12];
  undefined4 in_stack_fffffffffffffe24;
  Int IVar30;
  MakefileGenerator *pMVar31;
  QStringBuilder<QString,_QString> *local_1c0;
  QStringBuilder<QString_&,_QString_&> local_1b8;
  QFileInfo in_fi;
  QMakeProject *pQStack_1a0;
  Data *local_198;
  QFileInfo in_fi_1;
  Data *pDStack_170;
  Data *local_168;
  QStringBuilder<QString,_QString> local_148;
  Data *pDStack_118;
  QFileInfo qfileinfo;
  Data *local_108;
  SourceFiles *pSStack_100;
  QHash<QString,_bool> local_f8;
  QHash<QString,_QMakeLocalFileName> local_f0;
  QHash<QString,_QList<QString>_> local_e8;
  QHash<ReplaceExtraCompilerCacheKey,_QString> local_e0;
  QStringBuilder<QString,_QString> *local_d8;
  QMakeProject *local_d0;
  Data *local_c8;
  QHash<QString,_QMakeLocalFileName> local_c0;
  QHash<QString,_QList<QString>_> local_b8;
  QHash<ReplaceExtraCompilerCacheKey,_QString> local_b0;
  QString local_a8;
  QStringBuilder<QString,_QString> local_88;
  QHash<QString,_QMakeLocalFileName> local_58;
  QHash<QString,_QList<QString>_> QStack_50;
  QHash<ReplaceExtraCompilerCacheKey,_QString> local_48;
  QMakeProject *local_38;
  
  pDVar15 = local_198;
  pQVar21 = pQStack_1a0;
  local_38 = *(QMakeProject **)(in_FS_OFFSET + 0x28);
  lVar1 = (file->d).size;
  if (lVar1 == 0) {
    pDVar2 = (file->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (file->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00159789;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = (file->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (file->d).ptr;
  (__return_storage_ptr__->d).size = lVar1;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.d = (Data *)(__return_storage_ptr__->d).d;
  QStack_50.d = (Data *)(__return_storage_ptr__->d).ptr;
  local_48.d = (Data *)(__return_storage_ptr__->d).size;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    (((QArrayData *)&(local_58.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&(local_58.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  cVar8 = QString::startsWith((QChar)(char16_t)__return_storage_ptr__,0x7e);
  pMVar31 = this;
  if (cVar8 != '\0') {
    QVar22.m_data = (char *)0x2;
    QVar22.m_size = (qsizetype)__return_storage_ptr__;
    cVar8 = QString::startsWith(QVar22,0x2a95fb);
    if (cVar8 == '\0') {
      unaff_R14 = &local_88;
      QString::toLatin1_helper((QString *)unaff_R14);
      pQVar21 = (QMakeProject *)local_88.a.d.ptr;
      if ((QMakeProject *)local_88.a.d.ptr == (QMakeProject *)0x0) {
        pQVar21 = (QMakeProject *)&QByteArray::_empty;
      }
      warn_msg(WarnLogic,"Unable to expand ~ in %s",pQVar21);
      if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
          (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d)->_M_i
             + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d)->_M_i
            == 0) {
          lVar16 = 1;
          pQVar17 = (QStringBuilder<QString,_QString> *)local_88.a.d.d;
          goto LAB_00158617;
        }
      }
    }
    else {
      QDir::homePath();
      QString::mid((longlong)&local_a8,(longlong)__return_storage_ptr__);
      local_88.b.d.size = local_a8.d.size;
      local_88.b.d.ptr = local_a8.d.ptr;
      local_88.b.d.d = local_a8.d.d;
      local_88.a.d.d = (Data *)_in_fi;
      _in_fi = (QStringBuilder<QString,_QString> *)0x0;
      pQStack_1a0 = (QMakeProject *)0x0;
      local_88.a.d.ptr = (char16_t *)pQVar21;
      local_198 = (Data *)0x0;
      local_88.a.d.size = (qsizetype)pDVar15;
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char16_t *)0x0;
      local_a8.d.size = 0;
      unaff_R14 = (QStringBuilder<QString,_QString> *)&in_fi_1;
      QStringBuilder<QString,_QString>::convertTo<QString>((QString *)unaff_R14,&local_88);
      pQVar17 = (QStringBuilder<QString,_QString> *)(__return_storage_ptr__->d).d;
      pDVar14 = (Data *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi_1;
      (__return_storage_ptr__->d).ptr = (char16_t *)pDStack_170;
      pDVar15 = (Data *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = (qsizetype)local_168;
      _in_fi_1 = pQVar17;
      if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i =
             ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i == 0) {
          QArrayData::deallocate((QArrayData *)pQVar17,2,0x10);
        }
      }
      QStringBuilder<QString,_QString>::~QStringBuilder(&local_88);
      this = pMVar31;
      if ((QStringBuilder<QString,_QString> *)local_a8.d.d !=
          (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      pDStack_170 = pDVar14;
      local_168 = pDVar15;
      pMVar31 = this;
      if (_in_fi != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(_in_fi->a).d.d)->_M_i =
             ((__atomic_base<int> *)&(_in_fi->a).d.d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(_in_fi->a).d.d)->_M_i == 0) {
          lVar16 = 2;
          pQVar17 = _in_fi;
LAB_00158617:
          QArrayData::deallocate((QArrayData *)pQVar17,lVar16,0x10);
        }
      }
    }
  }
  pDVar15 = local_168;
  bVar10 = true;
  if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
             super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 4) == 0) {
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 8) == 0) {
      pQVar21 = pMVar31->project;
      QVar23.m_data = (storage_type *)0xa;
      QVar23.m_size = (qsizetype)&local_88;
      this = pMVar31;
      QString::fromUtf8(QVar23);
      unaff_R14 = (QStringBuilder<QString,_QString> *)local_88.a.d.d;
      bVar10 = false;
      config.m_data = local_88.a.d.ptr;
      config.m_size = local_88.a.d.size;
      pMVar31 = this;
      bVar9 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config,false);
    }
    else {
      bVar9 = false;
    }
  }
  else {
    bVar9 = true;
  }
  if (unaff_R14 != (QStringBuilder<QString,_QString> *)0x0 && !bVar10) {
    LOCK();
    *(int *)&(unaff_R14->a).d.d = *(int *)&(unaff_R14->a).d.d + -1;
    UNLOCK();
    if (*(int *)&(unaff_R14->a).d.d == 0) {
      QArrayData::deallocate((QArrayData *)unaff_R14,2,0x10);
    }
  }
  if (bVar9 == false) {
    pDVar15 = (Data *)Option::output_dir.d.size;
    pQVar17 = (QStringBuilder<QString,_QString> *)Option::output_dir.d.d;
    pQVar21 = (QMakeProject *)Option::output_dir.d.ptr;
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 2) != 0) {
      pQVar21 = this->project;
      pDVar15 = (Data *)(pQVar21->m_projectDir).d.size;
      pQVar17 = (QStringBuilder<QString,_QString> *)(pQVar21->m_projectDir).d.d;
      pQVar21 = (QMakeProject *)(pQVar21->m_projectDir).d.ptr;
    }
    if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(pQVar17->a).d.d = *(int *)&(pQVar17->a).d.d + 1;
      UNLOCK();
    }
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 1) == 0) {
      pQVar18 = this->project;
      local_a8.d.ptr = (pQVar18->m_projectDir).d.ptr;
      local_a8.d.size = (pQVar18->m_projectDir).d.size;
      local_d8 = (QStringBuilder<QString,_QString> *)(pQVar18->m_projectDir).d.d;
    }
    else {
      local_a8.d.ptr = Option::output_dir.d.ptr;
      local_a8.d.size = Option::output_dir.d.size;
      local_d8 = (QStringBuilder<QString,_QString> *)Option::output_dir.d.d;
    }
    if (local_d8 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(local_d8->a).d.d)->_M_i =
           ((__atomic_base<int> *)&(local_d8->a).d.d)->_M_i + 1;
      UNLOCK();
    }
    _in_fi_1 = (QStringBuilder<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    local_d0 = (QMakeProject *)local_a8.d.ptr;
    local_c8 = (Data *)local_a8.d.size;
    if (local_d8 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(local_d8->a).d.d)->_M_i =
           ((__atomic_base<int> *)&(local_d8->a).d.d)->_M_i + 1;
      UNLOCK();
    }
    file_00.d.ptr._4_4_ =
         (FileFixifyTypes)
         (FileFixifyTypes)
         fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
         super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
    file_00.d._0_12_ = in_stack_fffffffffffffe18;
    file_00.d.size._0_4_ = (int)pMVar31;
    file_00.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
    local_a8.d.d = (Data *)local_d8;
    fileInfo((MakefileGenerator *)&in_fi_1,file_00);
    if (local_d8 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(local_d8->a).d.d = *(int *)&(local_d8->a).d.d + -1;
      UNLOCK();
      if (*(int *)&(local_d8->a).d.d == 0) {
        QArrayData::deallocate((QArrayData *)local_d8,2,0x10);
      }
    }
    cVar8 = QFileInfo::exists();
    if (cVar8 != '\0') {
      QFileInfo::canonicalFilePath();
      qVar5 = local_88.a.d.size;
      pDVar7 = local_88.a.d.d;
      pcVar4 = local_a8.d.ptr;
      pDVar2 = local_a8.d.d;
      local_88.a.d.d = local_a8.d.d;
      local_a8.d.d = pDVar7;
      local_a8.d.ptr = local_88.a.d.ptr;
      local_88.a.d.ptr = pcVar4;
      local_88.a.d.size = local_a8.d.size;
      local_a8.d.size = qVar5;
      if ((QStringBuilder<QString,_QString> *)pDVar2 != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d =
             *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
    }
    _in_fi = (QStringBuilder<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(pQVar17->a).d.d = *(int *)&(pQVar17->a).d.d + 1;
      UNLOCK();
    }
    file_01.d.ptr._4_4_ =
         (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
              super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
    file_01.d._0_12_ = in_stack_fffffffffffffe18;
    file_01.d.size._0_4_ = (int)pMVar31;
    file_01.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
    local_f0.d = (Data *)pQVar17;
    local_e8.d = (Data *)pQVar21;
    local_e0.d = pDVar15;
    fileInfo((MakefileGenerator *)&in_fi,file_01);
    if ((QStringBuilder<QString,_QString> *)local_f0.d != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f0.d)->ref)->d).d =
           *(int *)&(((QString *)&(local_f0.d)->ref)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f0.d)->ref)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_f0.d,2,0x10);
      }
    }
    cVar8 = QFileInfo::exists();
    pDVar20 = pDVar15;
    pQVar18 = pQVar21;
    local_1c0 = pQVar17;
    if (cVar8 != '\0') {
      QFileInfo::canonicalFilePath();
      pDVar20 = (Data *)local_88.a.d.size;
      pQVar18 = (QMakeProject *)local_88.a.d.ptr;
      local_1c0 = (QStringBuilder<QString,_QString> *)local_88.a.d.d;
      local_88.a.d.d = (Data *)pQVar17;
      local_88.a.d.ptr = (char16_t *)pQVar21;
      local_88.a.d.size = (qsizetype)pDVar15;
      if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(pQVar17->a).d.d = *(int *)&(pQVar17->a).d.d + -1;
        UNLOCK();
        if (*(int *)&(pQVar17->a).d.d == 0) {
          QArrayData::deallocate((QArrayData *)pQVar17,2,0x10);
        }
      }
    }
    QFileInfo::~QFileInfo(&in_fi);
    QFileInfo::~QFileInfo(&in_fi_1);
    local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pSStack_100 = (SourceFiles *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.a.d.d = (__return_storage_ptr__->d).d;
    local_88.a.d.ptr = (__return_storage_ptr__->d).ptr;
    local_88.a.d.size = (__return_storage_ptr__->d).size;
    if (&(local_88.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_88.a.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_88.a.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string.d.ptr._4_4_ =
         (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
              super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
    string.d._0_12_ = in_stack_fffffffffffffe18;
    string.d.size._0_4_ = (int)pMVar31;
    string.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
    Option::fixString((QString *)&local_108,string,(uchar)&local_88);
    if (&(local_88.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    _qfileinfo = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_148.b.d.ptr = (char16_t *)local_108;
    local_148.b.d.size = (qsizetype)pSStack_100;
    pDStack_118 = local_f8.d;
    if (local_108 != (Data *)0x0) {
      LOCK();
      (local_108->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (local_108->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file_02.d.ptr._4_4_ =
         (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
              super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
    file_02.d._0_12_ = in_stack_fffffffffffffe18;
    file_02.d.size._0_4_ = (int)pMVar31;
    file_02.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
    fileInfo((MakefileGenerator *)&qfileinfo,file_02);
    if ((Data *)local_148.b.d.ptr != (Data *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_148.b.d.ptr)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_148.b.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_148.b.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_148.b.d.ptr,2,0x10);
      }
    }
    if ((pDVar20 == (Data *)local_a8.d.size) &&
       (QVar24.m_data = (storage_type_conflict *)pQVar18, QVar24.m_size = (qsizetype)pDVar20,
       QVar28.m_data = local_a8.d.ptr, QVar28.m_size = local_a8.d.size,
       cVar8 = QtPrivate::equalStrings(QVar24,QVar28), cVar8 != '\0')) {
      cVar8 = QFileInfo::isRelative();
      if (cVar8 == '\0') goto LAB_00158c04;
      local_88.a.d.d = (__return_storage_ptr__->d).d;
      local_88.a.d.ptr = (__return_storage_ptr__->d).ptr;
      local_88.a.d.size = (__return_storage_ptr__->d).size;
      if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
          (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(((QStringBuilder<QString,_QString> *)local_88.a.d.d)->a).d.d =
             *(int *)&(((QStringBuilder<QString,_QString> *)local_88.a.d.d)->a).d.d + 1;
        UNLOCK();
      }
      string_00.d.ptr._4_4_ =
           (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      string_00.d._0_12_ = in_stack_fffffffffffffe18;
      string_00.d.size._0_4_ = (int)pMVar31;
      string_00.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
      Option::fixString((QString *)&in_fi_1,string_00,(uchar)&local_88);
      if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
          (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar17 = (QStringBuilder<QString,_QString> *)(__return_storage_ptr__->d).d;
      pSVar6 = (SourceFiles *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi_1;
      (__return_storage_ptr__->d).ptr = (char16_t *)pDStack_170;
      (__return_storage_ptr__->d).size = (qsizetype)local_168;
      _in_fi_1 = pQVar17;
      pDStack_170 = (Data *)pSVar6;
      if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(pQVar17->a).d.d = *(int *)&(pQVar17->a).d.d + -1;
        UNLOCK();
        if (*(int *)&(pQVar17->a).d.d != 0) goto LAB_00159531;
LAB_00159522:
        QArrayData::deallocate((QArrayData *)pQVar17,2,0x10);
      }
    }
    else {
LAB_00158c04:
      cVar8 = QFileInfo::isRelative();
      if (cVar8 != '\0') {
        _in_fi_1 = (QStringBuilder<QString,_QString> *)&local_a8;
        pDStack_170 = (Data *)0x2a6ddb;
        QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::convertTo<QString>
                  (&local_88.a,
                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                   &in_fi_1);
        pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pcVar4 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_88.a.d.d;
        (__return_storage_ptr__->d).ptr = local_88.a.d.ptr;
        qVar5 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_88.a.d.size;
        local_88.a.d.d = (Data *)pQVar3;
        local_88.a.d.ptr = pcVar4;
        local_88.a.d.size = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,2,0x10);
          }
        }
        QFileInfo::setFile((QString *)&qfileinfo);
        local_168 = (Data *)&local_108;
      }
      local_88.a.d.d = (__return_storage_ptr__->d).d;
      local_88.a.d.ptr = (__return_storage_ptr__->d).ptr;
      local_88.a.d.size = (__return_storage_ptr__->d).size;
      if (&(local_88.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_88.a.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_88.a.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string_01.d.ptr._4_4_ =
           (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      string_01.d._0_12_ = in_stack_fffffffffffffe18;
      string_01.d.size._0_4_ = (int)pMVar31;
      string_01.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
      Option::fixString((QString *)&in_fi_1,string_01,(uchar)&local_88);
      if (&(local_88.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar17 = (QStringBuilder<QString,_QString> *)(__return_storage_ptr__->d).d;
      pSVar6 = (SourceFiles *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi_1;
      (__return_storage_ptr__->d).ptr = (char16_t *)pDStack_170;
      (__return_storage_ptr__->d).size = (qsizetype)local_168;
      _in_fi_1 = pQVar17;
      if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i =
             ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i == 0) {
          QArrayData::deallocate((QArrayData *)pQVar17,2,0x10);
        }
      }
      local_148.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_148.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.a.d.d = (Data *)local_1c0;
      if (local_1c0 != (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(local_1c0->a).d.d)->_M_i =
             ((__atomic_base<int> *)&(local_1c0->a).d.d)->_M_i + 1;
        UNLOCK();
      }
      string_02.d.ptr._4_4_ =
           (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      string_02.d._0_12_ = in_stack_fffffffffffffe18;
      string_02.d.size._0_4_ = (int)pMVar31;
      string_02.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
      local_88.a.d.ptr = (char16_t *)pQVar18;
      local_88.a.d.size = (qsizetype)pDVar20;
      Option::fixString(&local_148.a,string_02,(uchar)&local_88);
      IVar30 = (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                    super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
          (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pDVar15 = (Data *)(__return_storage_ptr__->d).size;
      if ((pDVar15 == (Data *)local_148.a.d.size) &&
         (QVar25.m_data = (__return_storage_ptr__->d).ptr, QVar25.m_size = (qsizetype)pDVar15,
         QVar29.m_data = local_148.a.d.ptr, QVar29.m_size = local_148.a.d.size,
         cVar8 = QtPrivate::equalStrings(QVar25,QVar29), cVar8 != '\0')) {
        QVar26.m_size = (size_t)"";
        QVar26.field_0.m_data = __return_storage_ptr__;
        QString::assign(QVar26);
        pDStack_170 = (Data *)pSVar6;
      }
      else {
        pDStack_170 = (Data *)&Option::dir_sep;
        _in_fi_1 = &local_148;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  (&local_88.a,(QStringBuilder<QString_&,_QString_&> *)&in_fi_1);
        cVar8 = QString::startsWith((QString *)__return_storage_ptr__,(CaseSensitivity)&local_88);
        if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
            (QStringBuilder<QString,_QString> *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (cVar8 == '\0') {
          iVar11 = 4;
          fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
          super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
               (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)
               (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)IVar30;
          if ((Option::qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
            pQVar21 = pMVar31->project;
            if (pQVar21 == (QMakeProject *)0x0) {
              bVar10 = false;
            }
            else {
              ProKey::ProKey((ProKey *)&local_88,"QMAKE_PROJECT_DEPTH");
              bVar10 = QMakeProject::isEmpty(pQVar21,(ProKey *)&local_88);
              bVar10 = !bVar10;
              fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
              super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
                   (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)
                   (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)IVar30;
              if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
                  (QStringBuilder<QString,_QString> *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
                  fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                  super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i =
                       (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)
                       (QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>)IVar30;
                }
              }
            }
            if (bVar10) {
              pQVar21 = pMVar31->project;
              ProKey::ProKey((ProKey *)&in_fi,"QMAKE_PROJECT_DEPTH");
              QMakeEvaluator::first
                        ((ProString *)&in_fi_1,&pQVar21->super_QMakeEvaluator,(ProKey *)&in_fi);
              iVar11 = ProString::toInt((ProString *)&in_fi_1,(bool *)0x0,10);
              if (_in_fi_1 != (QStringBuilder<QString,_QString> *)0x0) {
                LOCK();
                *(int *)&(_in_fi_1->a).d.d = *(int *)&(_in_fi_1->a).d.d + -1;
                UNLOCK();
                if (*(int *)&(_in_fi_1->a).d.d == 0) {
                  QArrayData::deallocate((QArrayData *)_in_fi_1,2,0x10);
                }
              }
              if (_in_fi != (QStringBuilder<QString,_QString> *)0x0) {
                LOCK();
                *(int *)&(_in_fi->a).d.d = *(int *)&(_in_fi->a).d.d + -1;
                UNLOCK();
                if (*(int *)&(_in_fi->a).d.d == 0) {
                  QArrayData::deallocate((QArrayData *)_in_fi,2,0x10);
                }
              }
            }
            else {
              iVar11 = 4;
              if (Option::mkfile::cachefile_depth != -1) {
                iVar11 = Option::mkfile::cachefile_depth;
              }
            }
          }
          _in_fi_1 = (QStringBuilder<QString,_QString> *)0x0;
          pDStack_170 = (Data *)0x0;
          if (0 < iVar11) {
            iVar19 = 1;
LAB_001592d1:
            iVar12 = QString::lastIndexOf
                               ((QString *)&local_148,0x2e2bf0,(CaseSensitivity)local_148.a.d.size);
            if (iVar12 != -1) {
              if ((Data *)(long)iVar12 < (ulong)local_148.a.d.size) {
                QString::QString((QString *)&in_fi,(QChar *)local_148.a.d.ptr,(longlong)(long)iVar12
                                );
              }
              else {
                _in_fi = (QStringBuilder<QString,_QString> *)local_148.a.d.d;
                pQStack_1a0 = (QMakeProject *)local_148.a.d.ptr;
                local_198 = (Data *)local_148.a.d.size;
                if ((QStringBuilder<QString,_QString> *)local_148.a.d.d !=
                    (QStringBuilder<QString,_QString> *)0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d)
                  ->_M_i = ((__atomic_base<int> *)
                           &(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d)->_M_i + 1;
                  UNLOCK();
                }
              }
              qVar5 = local_148.a.d.size;
              pcVar4 = local_148.a.d.ptr;
              pDVar2 = local_148.a.d.d;
              pDVar15 = local_198;
              pQVar17 = _in_fi;
              _in_fi = (QStringBuilder<QString,_QString> *)local_148.a.d.d;
              local_148.a.d.d = (Data *)pQVar17;
              local_148.a.d.ptr = (char16_t *)pQStack_1a0;
              pQStack_1a0 = (QMakeProject *)pcVar4;
              local_198 = (Data *)local_148.a.d.size;
              local_148.a.d.size = (qsizetype)pDVar15;
              if ((QStringBuilder<QString,_QString> *)pDVar2 !=
                  (QStringBuilder<QString,_QString> *)0x0) {
                LOCK();
                *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
                }
              }
              if ((Data *)local_148.a.d.size != (Data *)0x0) {
                local_1b8.b = &Option::dir_sep;
                local_1b8.a = &local_148.a;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          ((QString *)&in_fi,&local_1b8);
                cVar8 = QString::startsWith((QString *)__return_storage_ptr__,
                                            (CaseSensitivity)&in_fi);
                if (_in_fi != (QStringBuilder<QString,_QString> *)0x0) {
                  LOCK();
                  *(int *)&(_in_fi->a).d.d = *(int *)&(_in_fi->a).d.d + -1;
                  UNLOCK();
                  if (*(int *)&(_in_fi->a).d.d == 0) {
                    QArrayData::deallocate((QArrayData *)_in_fi,2,0x10);
                  }
                }
                if (cVar8 == '\0') goto code_r0x001593fc;
                uVar13 = ~(uint)local_148.a.d.size + (int)(__return_storage_ptr__->d).size;
                n = 0;
                if (0 < (int)uVar13) {
                  n = (ulong)uVar13;
                }
                QString::right((QString *)&in_fi,__return_storage_ptr__,n);
                pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
                (__return_storage_ptr__->d).d = (Data *)_in_fi;
                (__return_storage_ptr__->d).ptr = pcVar4;
                (__return_storage_ptr__->d).size = qVar5;
                if (pQVar3 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    _in_fi = (QStringBuilder<QString,_QString> *)pQVar3;
                    QArrayData::deallocate(pQVar3,2,0x10);
                  }
                }
                do {
                  _in_fi = (QStringBuilder<QString,_QString> *)0x2aeb64;
                  pQStack_1a0 = (QMakeProject *)&Option::dir_sep;
                  ::operator+=((QString *)&in_fi_1,
                               (QStringBuilder<const_char_(&)[3],_QString_&> *)&in_fi);
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
            }
          }
LAB_001594b3:
          QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)&QString::_empty);
          if (_in_fi_1 != (QStringBuilder<QString,_QString> *)0x0) {
            LOCK();
            *(int *)&(_in_fi_1->a).d.d = *(int *)&(_in_fi_1->a).d.d + -1;
            iVar11 = *(int *)&(_in_fi_1->a).d.d;
            UNLOCK();
            pQVar17 = _in_fi_1;
            goto joined_r0x001594ed;
          }
        }
        else {
          QString::mid((longlong)&local_88,(longlong)__return_storage_ptr__);
          pQVar17 = (QStringBuilder<QString,_QString> *)(__return_storage_ptr__->d).d;
          pQVar21 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = local_88.a.d.d;
          (__return_storage_ptr__->d).ptr = local_88.a.d.ptr;
          pDVar15 = (Data *)(__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = local_88.a.d.size;
          local_88.a.d.d = (Data *)pQVar17;
          local_88.a.d.ptr = (char16_t *)pQVar21;
          local_88.a.d.size = (qsizetype)pDVar15;
          if (pQVar17 != (QStringBuilder<QString,_QString> *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i =
                 ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i + -1;
            iVar11 = ((__atomic_base<int> *)&(pQVar17->a).d.d)->_M_i;
            UNLOCK();
joined_r0x001594ed:
            if (iVar11 == 0) {
              QArrayData::deallocate((QArrayData *)pQVar17,2,0x10);
            }
          }
        }
      }
      if ((QStringBuilder<QString,_QString> *)local_148.a.d.d !=
          (QStringBuilder<QString,_QString> *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d)->_M_i
             + -1;
        UNLOCK();
        pQVar17 = (QStringBuilder<QString,_QString> *)local_148.a.d.d;
        if (((__atomic_base<int> *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d)->_M_i
            == 0) goto LAB_00159522;
      }
    }
LAB_00159531:
    QFileInfo::~QFileInfo(&qfileinfo);
    if (local_108 != (Data *)0x0) {
      LOCK();
      (local_108->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (local_108->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_108->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_108,2,0x10);
      }
    }
    if ((QStringBuilder<QString,_QString> *)local_a8.d.d != (QStringBuilder<QString,_QString> *)0x0)
    {
      LOCK();
      *(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_1c0 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(local_1c0->a).d.d)->_M_i =
           ((__atomic_base<int> *)&(local_1c0->a).d.d)->_M_i + -1;
      iVar11 = ((__atomic_base<int> *)&(local_1c0->a).d.d)->_M_i;
      UNLOCK();
      goto joined_r0x0015959d;
    }
  }
  else {
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 4) != 0) {
      cVar8 = QDir::isRelativePath((QString *)__return_storage_ptr__);
      if (cVar8 != '\0') {
        if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                   super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 1) == 0) {
          pQVar21 = this->project;
          local_88.a.d.ptr = (pQVar21->m_projectDir).d.ptr;
          local_88.a.d.size = (pQVar21->m_projectDir).d.size;
          local_c0.d = (Data *)(pQVar21->m_projectDir).d.d;
        }
        else {
          local_88.a.d.ptr = Option::output_dir.d.ptr;
          local_88.a.d.size = Option::output_dir.d.size;
          local_c0.d = (Data *)Option::output_dir.d.d;
        }
        if ((QStringBuilder<QString,_QString> *)local_c0.d !=
            (QStringBuilder<QString,_QString> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QString> *)local_c0.d)->a).d.d =
               *(int *)&(((QStringBuilder<QString,_QString> *)local_c0.d)->a).d.d + 1;
          UNLOCK();
        }
        _in_fi = (QStringBuilder<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d = (Data *)local_88.a.d.ptr;
        local_b0.d = (Data *)local_88.a.d.size;
        if ((QStringBuilder<QString,_QString> *)local_c0.d !=
            (QStringBuilder<QString,_QString> *)0x0) {
          LOCK();
          *(int *)&(((QStringBuilder<QString,_QString> *)local_c0.d)->a).d.d =
               *(int *)&(((QStringBuilder<QString,_QString> *)local_c0.d)->a).d.d + 1;
          UNLOCK();
        }
        file_03.d.ptr._4_4_ = in_stack_fffffffffffffe24;
        file_03.d._0_12_ = in_stack_fffffffffffffe18;
        file_03.d.size._0_4_ = (int)pMVar31;
        file_03.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
        local_88.a.d.d = (Data *)local_c0.d;
        fileInfo((MakefileGenerator *)&in_fi,file_03);
        if ((QStringBuilder<QString,_QString> *)local_c0.d !=
            (QStringBuilder<QString,_QString> *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_c0.d)->ref)->d).d =
               *(int *)&(((QString *)&(local_c0.d)->ref)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_c0.d)->ref)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_c0.d,2,0x10);
          }
        }
        cVar8 = QFileInfo::exists();
        if (cVar8 != '\0') {
          QFileInfo::canonicalFilePath();
          pcVar4 = local_88.a.d.ptr;
          pDVar2 = local_88.a.d.d;
          pQVar17 = _in_fi_1;
          _in_fi_1 = (QStringBuilder<QString,_QString> *)local_88.a.d.d;
          local_88.a.d.d = (Data *)pQVar17;
          local_88.a.d.ptr = (char16_t *)pDStack_170;
          pDStack_170 = (Data *)pcVar4;
          local_168 = (Data *)local_88.a.d.size;
          local_88.a.d.size = (qsizetype)pDVar15;
          if ((QStringBuilder<QString,_QString> *)pDVar2 != (QStringBuilder<QString,_QString> *)0x0)
          {
            LOCK();
            *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&pDVar2->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
            }
          }
        }
        QFileInfo::~QFileInfo(&in_fi);
        cVar8 = QString::endsWith((QChar)(char16_t)&local_88,0x2f);
        if (cVar8 == '\0') {
          QString::append((QChar)(char16_t)&local_88);
        }
        pDVar14 = (Data *)local_88.a.d.ptr;
        if ((Data *)local_88.a.d.ptr == (Data *)0x0) {
          pDVar14 = (Data *)&QString::_empty;
        }
        QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)pDVar14);
        if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
            (QStringBuilder<QString,_QString> *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    local_88.a.d.d = (__return_storage_ptr__->d).d;
    local_88.a.d.ptr = (__return_storage_ptr__->d).ptr;
    local_88.a.d.size = (__return_storage_ptr__->d).size;
    if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
        (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(((QStringBuilder<QString,_QString> *)local_88.a.d.d)->a).d.d =
           *(int *)&(((QStringBuilder<QString,_QString> *)local_88.a.d.d)->a).d.d + 1;
      UNLOCK();
    }
    string_03.d.ptr._4_4_ = in_stack_fffffffffffffe24;
    string_03.d._0_12_ = in_stack_fffffffffffffe18;
    string_03.d.size._0_4_ = (int)pMVar31;
    string_03.d.size._4_4_ = (int)((ulong)pMVar31 >> 0x20);
    Option::fixString((QString *)&in_fi_1,string_03,(uchar)&local_88);
    if ((QStringBuilder<QString,_QString> *)local_88.a.d.d !=
        (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_88.a.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_88.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_1c0 = (QStringBuilder<QString,_QString> *)(__return_storage_ptr__->d).d;
    pSVar6 = (SourceFiles *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)_in_fi_1;
    (__return_storage_ptr__->d).ptr = (char16_t *)pDStack_170;
    (__return_storage_ptr__->d).size = (qsizetype)local_168;
    _in_fi_1 = local_1c0;
    pDStack_170 = (Data *)pSVar6;
    if (local_1c0 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(local_1c0->a).d.d = *(int *)&(local_1c0->a).d.d + -1;
      iVar11 = *(int *)&(local_1c0->a).d.d;
      UNLOCK();
joined_r0x0015959d:
      if (iVar11 == 0) {
        QArrayData::deallocate((QArrayData *)local_1c0,2,0x10);
      }
    }
  }
  uVar13 = (uint)canon;
  if ((__return_storage_ptr__->d).size == 0) {
    QVar27.m_size = (size_t)".";
    QVar27.field_0.m_data = __return_storage_ptr__;
    QString::assign(QVar27);
  }
  if (Option::debug_level != 0) {
    QString::toLatin1_helper((QString *)&in_fi_1);
    if (pDStack_170 == (Data *)0x0) {
      pDStack_170 = (Data *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&in_fi);
    if (pQStack_1a0 == (QMakeProject *)0x0) {
      pQStack_1a0 = (QMakeProject *)&QByteArray::_empty;
    }
    qmake_getpwd();
    QString::toLatin1_helper_inplace((QString *)&local_a8);
    pQVar21 = (QMakeProject *)local_a8.d.ptr;
    if ((QMakeProject *)local_a8.d.ptr == (QMakeProject *)0x0) {
      pQVar21 = (QMakeProject *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&local_148);
    pQVar18 = (QMakeProject *)local_148.a.d.ptr;
    if ((QMakeProject *)local_148.a.d.ptr == (QMakeProject *)0x0) {
      pQVar18 = (QMakeProject *)&QByteArray::_empty;
    }
    debug_msg_internal(3,"Fixed[%d,%d] %s :: to :: %s [%s::%s]",
                       (ulong)(uint)fix.
                                    super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                                    super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i,
                       (ulong)uVar13,pDStack_170,pQStack_1a0,pQVar21,pQVar18);
    if ((QStringBuilder<QString,_QString> *)local_148.a.d.d !=
        (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_148.a.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_148.a.d.d)->super_QArrayData,1,0x10);
      }
    }
    if ((QStringBuilder<QString,_QString> *)local_a8.d.d != (QStringBuilder<QString,_QString> *)0x0)
    {
      LOCK();
      *(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_a8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (local_108 != (Data *)0x0) {
      LOCK();
      (local_108->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (local_108->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_108->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_108,2,0x10);
      }
    }
    if (_in_fi != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(_in_fi->a).d.d = *(int *)&(_in_fi->a).d.d + -1;
      UNLOCK();
      if (*(int *)&(_in_fi->a).d.d == 0) {
        QArrayData::deallocate((QArrayData *)_in_fi,1,0x10);
      }
    }
    if (_in_fi_1 != (QStringBuilder<QString,_QString> *)0x0) {
      LOCK();
      *(int *)&(_in_fi_1->a).d.d = *(int *)&(_in_fi_1->a).d.d + -1;
      UNLOCK();
      if (*(int *)&(_in_fi_1->a).d.d == 0) {
        QArrayData::deallocate((QArrayData *)_in_fi_1,1,0x10);
      }
    }
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58.d,2,0x10);
    }
  }
LAB_00159789:
  if (*(QMakeProject **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
code_r0x001593fc:
  bVar10 = iVar19 == iVar11;
  iVar19 = iVar19 + 1;
  if (bVar10) goto LAB_001594b3;
  goto LAB_001592d1;
}

Assistant:

QString
MakefileGenerator::fileFixify(const QString &file, FileFixifyTypes fix, bool canon) const
{
    if(file.isEmpty())
        return file;
    QString ret = file;

    //do the fixin'
    QString orig_file = ret;
    if(ret.startsWith(QLatin1Char('~'))) {
        if(ret.startsWith(QLatin1String("~/")))
            ret = QDir::homePath() + ret.mid(1);
        else
            warn_msg(WarnLogic, "Unable to expand ~ in %s", ret.toLatin1().constData());
    }
    if ((fix & FileFixifyAbsolute)
            || (!(fix & FileFixifyRelative) && project->isActiveConfig("no_fixpath"))) {
        if ((fix & FileFixifyAbsolute) && QDir::isRelativePath(ret)) {
            QString pwd = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
            {
                QFileInfo in_fi(fileInfo(pwd));
                if (in_fi.exists())
                    pwd = in_fi.canonicalFilePath();
            }
            if (!pwd.endsWith(QLatin1Char('/')))
                pwd += QLatin1Char('/');
            ret.prepend(pwd);
        }
        ret = Option::fixPathToTargetOS(ret, false, canon);
    } else { //fix it..
        QString out_dir = (fix & FileFixifyToIndir) ? project->projectDir() : Option::output_dir;
        QString in_dir  = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
        {
            QFileInfo in_fi(fileInfo(in_dir));
            if(in_fi.exists())
                in_dir = in_fi.canonicalFilePath();
            QFileInfo out_fi(fileInfo(out_dir));
            if(out_fi.exists())
                out_dir = out_fi.canonicalFilePath();
        }

        QString qfile(Option::normalizePath(ret));
        QFileInfo qfileinfo(fileInfo(qfile));
        if(out_dir != in_dir || !qfileinfo.isRelative()) {
            if(qfileinfo.isRelative()) {
                ret = in_dir + "/" + qfile;
                qfileinfo.setFile(ret);
            }
            ret = Option::fixPathToTargetOS(ret, false, canon);
            QString match_dir = Option::fixPathToTargetOS(out_dir, false, canon);
            if(ret == match_dir) {
                ret = "";
            } else if(ret.startsWith(match_dir + Option::dir_sep)) {
                ret = ret.mid(match_dir.size() + Option::dir_sep.size());
            } else {
                //figure out the depth
                int depth = 4;
                if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                   Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                    if(project && !project->isEmpty("QMAKE_PROJECT_DEPTH"))
                        depth = project->first("QMAKE_PROJECT_DEPTH").toInt();
                    else if(Option::mkfile::cachefile_depth != -1)
                        depth = Option::mkfile::cachefile_depth;
                }
                //calculate how much can be removed
                QString dot_prefix;
                for(int i = 1; i <= depth; i++) {
                    int sl = match_dir.lastIndexOf(Option::dir_sep);
                    if(sl == -1)
                        break;
                    match_dir = match_dir.left(sl);
                    if(match_dir.isEmpty())
                        break;
                    if(ret.startsWith(match_dir + Option::dir_sep)) {
                        //concat
                        int remlen = ret.size() - (match_dir.size() + 1);
                        if(remlen < 0)
                            remlen = 0;
                        ret = ret.right(remlen);
                        //prepend
                        for(int o = 0; o < i; o++)
                            dot_prefix += ".." + Option::dir_sep;
                        break;
                    }
                }
                ret.prepend(dot_prefix);
            }
        } else {
            ret = Option::fixPathToTargetOS(ret, false, canon);
        }
    }
    if(ret.isEmpty())
        ret = ".";
    debug_msg(3, "Fixed[%d,%d] %s :: to :: %s [%s::%s]",
              int(fix), canon, orig_file.toLatin1().constData(), ret.toLatin1().constData(),
              qmake_getpwd().toLatin1().constData(), Option::output_dir.toLatin1().constData());
    return ret;
}